

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# exponentiation.cc
# Opt level: O3

int BN_mod_exp_mont_word(BIGNUM *r,ulong a,BIGNUM *p,BIGNUM *m,BN_CTX *ctx,BN_MONT_CTX *m_ctx)

{
  int iVar1;
  BIGNUM *a_00;
  
  iVar1 = bn_minimal_width((BIGNUM *)m);
  if (iVar1 == 1) {
    a = a % *m->d;
  }
  a_00 = BN_new();
  if (a_00 == (BIGNUM *)0x0) {
    iVar1 = 0;
    ERR_put_error(3,0,0x44,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/bn/exponentiation.cc"
                  ,0x85);
  }
  else {
    iVar1 = BN_set_word(a_00,a);
    if (iVar1 == 0) {
      iVar1 = 0;
      ERR_put_error(3,0,0x44,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/bn/exponentiation.cc"
                    ,0x85);
    }
    else {
      iVar1 = BN_mod_exp_mont(r,a_00,p,m,ctx,m_ctx);
    }
    BN_free(a_00);
  }
  return iVar1;
}

Assistant:

int BN_mod_exp_mont_word(BIGNUM *rr, BN_ULONG a, const BIGNUM *p,
                         const BIGNUM *m, BN_CTX *ctx,
                         const BN_MONT_CTX *mont) {
  // BN_mod_exp_mont requires reduced inputs.
  if (bn_minimal_width(m) == 1) {
    a %= m->d[0];
  }

  bssl::UniquePtr<BIGNUM> a_bignum(BN_new());
  if (a_bignum == nullptr || !BN_set_word(a_bignum.get(), a)) {
    OPENSSL_PUT_ERROR(BN, ERR_R_INTERNAL_ERROR);
    return 0;
  }

  return BN_mod_exp_mont(rr, a_bignum.get(), p, m, ctx, mont);
}